

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::double_writer::operator()
          (double_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it
          )

{
  double_writer dVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  double_writer *pdVar5;
  char *pcVar6;
  size_t sVar7;
  char cVar8;
  char *pcVar9;
  long lVar10;
  size_t sVar11;
  double_writer local_10 [8];
  
  dVar1 = this[8];
  if (dVar1 != (double_writer)0x0) {
    pdVar5 = (double_writer *)(it->super_truncating_iterator_base<char_*>).out_;
    uVar2 = (it->super_truncating_iterator_base<char_*>).count_;
    (it->super_truncating_iterator_base<char_*>).count_ = uVar2 + 1;
    if (uVar2 < (it->super_truncating_iterator_base<char_*>).limit_) {
      (it->super_truncating_iterator_base<char_*>).out_ = (char *)(pdVar5 + 1);
    }
    else {
      pdVar5 = local_10;
    }
    *pdVar5 = dVar1;
    *(long *)this = *(long *)this + -1;
  }
  lVar3 = *(long *)(*(long *)(this + 0x10) + 0x10);
  pcVar6 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar7 = (it->super_truncating_iterator_base<char_*>).count_;
  cVar8 = it->blackhole_;
  if (0 < lVar3) {
    pcVar9 = *(char **)(*(long *)(this + 0x10) + 8);
    lVar10 = lVar3 + 1;
    sVar11 = sVar7;
    do {
      cVar4 = *pcVar9;
      if (sVar11 < uVar2) {
        *pcVar6 = *pcVar9;
        pcVar6 = pcVar6 + 1;
        cVar4 = cVar8;
      }
      cVar8 = cVar4;
      sVar11 = sVar11 + 1;
      pcVar9 = pcVar9 + 1;
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
    sVar7 = sVar7 + lVar3;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pcVar6;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar7;
  it->blackhole_ = cVar8;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }